

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QToolBarAreaLayoutItem>::begin(QList<QToolBarAreaLayoutItem> *this)

{
  QToolBarAreaLayoutItem *n;
  QArrayDataPointer<QToolBarAreaLayoutItem> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QToolBarAreaLayoutItem> *)0x6fa5b9);
  QArrayDataPointer<QToolBarAreaLayoutItem>::operator->(in_RDI);
  n = QArrayDataPointer<QToolBarAreaLayoutItem>::begin
                ((QArrayDataPointer<QToolBarAreaLayoutItem> *)0x6fa5ca);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }